

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
tf::SmallVectorImpl<tf::Semaphore_*>::~SmallVectorImpl(SmallVectorImpl<tf::Semaphore_*> *this)

{
  if (*(SmallVectorImpl<tf::Semaphore_*> **)this == this + 0x18) {
    return;
  }
  free(*(SmallVectorImpl<tf::Semaphore_*> **)this);
  return;
}

Assistant:

~SmallVectorImpl() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());

    // If this wasn't grown from the inline copy, deallocate the old space.
    if (!this->isSmall())
      std::free(this->begin());
  }